

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  Schema *pSVar1;
  Vdbe *p;
  Schema **ppSVar2;
  int p1;
  int iVar3;
  long lVar4;
  byte bVar5;
  Index *pIdx;
  int iVar6;
  bool bVar7;
  
  iVar3 = 0;
  if (pTab->nModuleArg == 0) {
    if (pTab->pSchema == (Schema *)0x0) {
      iVar3 = -1000000;
    }
    else {
      iVar3 = -1;
      ppSVar2 = &pParse->db->aDb->pSchema;
      do {
        iVar3 = iVar3 + 1;
        pSVar1 = *ppSVar2;
        ppSVar2 = ppSVar2 + 4;
      } while (pSVar1 != pTab->pSchema);
    }
    p = sqlite3GetVdbe(pParse);
    if (iBase < 0) {
      iBase = pParse->nTab;
    }
    if (piDataCur != (int *)0x0) {
      *piDataCur = iBase;
    }
    if (((pTab->tabFlags & 0x20) == 0) && ((aToOpen == (u8 *)0x0 || (*aToOpen != '\0')))) {
      sqlite3OpenTable(pParse,iBase,iVar3,pTab,op);
    }
    else {
      sqlite3TableLock(pParse,iVar3,pTab->tnum,op == 0x6d,pTab->zName);
    }
    iVar6 = iBase + 1;
    if (piIdxCur != (int *)0x0) {
      *piIdxCur = iVar6;
    }
    pIdx = pTab->pIndex;
    if (pIdx == (Index *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      bVar5 = p5;
      do {
        p1 = iVar6 + (int)lVar4;
        if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) {
          bVar7 = (pTab->tabFlags & 0x20) != 0;
          p5 = bVar5;
          if (bVar7) {
            p5 = 0;
          }
          bVar5 = p5;
          if (bVar7 && piDataCur != (int *)0x0) {
            *piDataCur = p1;
            bVar5 = 0;
            p5 = 0;
          }
        }
        if ((aToOpen == (u8 *)0x0) || (aToOpen[lVar4 + 1] != '\0')) {
          sqlite3VdbeAddOp3(p,op,p1,pIdx->tnum,iVar3);
          sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = (ushort)p5;
          }
        }
        lVar4 = lVar4 + 1;
        pIdx = pIdx->pNext;
      } while (pIdx != (Index *)0x0);
      iVar6 = iVar6 + (int)lVar4;
    }
    iVar3 = (int)lVar4;
    if (pParse->nTab < iVar6) {
      pParse->nTab = iVar6;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur uninitialized so that valgrind
    ** can detect if they are used by mistake in the caller. */
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  if( piDataCur ) *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else{
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  if( piIdxCur ) *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      if( piDataCur ) *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}